

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

int Acb_NtkIsPiBuffers(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int *piVar2;
  
  while( true ) {
    iVar1 = Acb_ObjIsCi(p,iObj);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = Acb_ObjFaninNum(p,iObj);
    if (iVar1 != 1) break;
    piVar2 = Acb_ObjFanins(p,iObj);
    iObj = piVar2[1];
  }
  return 0;
}

Assistant:

int Acb_NtkIsPiBuffers( Acb_Ntk_t * p, int iObj )
{
    if ( Acb_ObjIsCi(p, iObj) )
        return 1;
    if ( Acb_ObjFaninNum(p, iObj) != 1 )
        return 0;
    return Acb_NtkIsPiBuffers( p, Acb_ObjFanin(p, iObj, 0) );
}